

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O0

BasicTypeKind
(anonymous_namespace)::selectTypeForValue<3ul>
          (PlatformOptions *platfOpts,unsigned_long_long v,BasicTypeKind (*candidates) [3])

{
  BasicTypeKind BVar1;
  ostream *poVar2;
  unsigned_long_long uStack_38;
  BasicTypeKind basicTyK;
  unsigned_long_long max;
  size_t i;
  BasicTypeKind (*candidates_local) [3];
  unsigned_long_long v_local;
  PlatformOptions *platfOpts_local;
  
  max = 0;
  while( true ) {
    if (1 < max) {
      return (*candidates)[2];
    }
    BVar1 = (*candidates)[max];
    switch(BVar1) {
    case Char:
      uStack_38 = psy::C::PlatformOptions::maxValueOf(platfOpts,Char);
      break;
    case Char_S:
      uStack_38 = psy::C::PlatformOptions::maxValueOf(platfOpts,Char_S);
      break;
    case Char_U:
      uStack_38 = psy::C::PlatformOptions::maxValueOf(platfOpts,Char_U);
      break;
    case Short_S:
      uStack_38 = psy::C::PlatformOptions::maxValueOf(platfOpts,Short_S);
      break;
    case Short_U:
      uStack_38 = psy::C::PlatformOptions::maxValueOf(platfOpts,Short_U);
      break;
    case Int_S:
      uStack_38 = psy::C::PlatformOptions::maxValueOf(platfOpts,Int_S);
      break;
    case Int_U:
      uStack_38 = psy::C::PlatformOptions::maxValueOf(platfOpts,Int_U);
      break;
    case Long_S:
      uStack_38 = psy::C::PlatformOptions::maxValueOf(platfOpts,Long_S);
      break;
    case Long_U:
      uStack_38 = psy::C::PlatformOptions::maxValueOf(platfOpts,Long_U);
      break;
    case LongLong_S:
      uStack_38 = psy::C::PlatformOptions::maxValueOf(platfOpts,LongLong_S);
      break;
    case LongLong_U:
      uStack_38 = psy::C::PlatformOptions::maxValueOf(platfOpts,LongLong_U);
      break;
    case Bool:
      uStack_38 = psy::C::PlatformOptions::maxValueOf(platfOpts,Bool);
      break;
    default:
      poVar2 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeChecker.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2c9);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = std::operator<<(poVar2,"<empty message>");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      return Int_S;
    }
    if (v <= uStack_38) break;
    max = max + 1;
  }
  return BVar1;
}

Assistant:

BasicTypeKind selectTypeForValue(
        const PlatformOptions& platfOpts,
        unsigned long long v,
        BasicTypeKind (&candidates)[N])
{
    for (size_t i = 0; i < N - 1; ++i) {
        unsigned long long max;
        BasicTypeKind basicTyK = candidates[i];
        switch (basicTyK) {
            case BasicTypeKind::Char:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::Char);
                break;
            case BasicTypeKind::Char_S:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::Char_S);
                break;
            case BasicTypeKind::Char_U:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::Char_U);
                break;
            case BasicTypeKind::Short_S:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::Short_S);
                break;
            case BasicTypeKind::Short_U:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::Short_U);
                break;
            case BasicTypeKind::Int_S:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::Int_S);
                break;
            case BasicTypeKind::Int_U:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::Int_U);
                break;
            case BasicTypeKind::Long_S:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::Long_S);
                break;
            case BasicTypeKind::Long_U:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::Long_U);
                break;
            case BasicTypeKind::LongLong_S:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::LongLong_S);
                break;
            case BasicTypeKind::LongLong_U:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::LongLong_U);
                break;
            case BasicTypeKind::Bool:
                max = platfOpts.maxValueOf(PlatformOptions::ArithmeticIntegerType::Bool);
                break;
            default:
                PSY_ASSERT_1(false);
                return BasicTypeKind::Int_S;
        }
        if (v <= max)
            return basicTyK;
    }
    return candidates[N-1];
}